

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O2

void __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax>::resetAll
          (SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> *this,BumpAllocator *alloc,
          span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL> children)

{
  int iVar1;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL> buffer;
  span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL> local_78;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL> local_68;
  
  local_78._M_extent = children._M_extent._M_extent_value;
  local_78._M_ptr = children._M_ptr;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL>::SmallVector
            (&local_68,local_78._M_extent._M_extent_value);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::
  append_range<std::span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL>_>
            (&local_68.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,&local_78);
  iVar1 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (&local_68.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (EVP_PKEY_CTX *)alloc,src);
  (this->elements)._M_ptr = (pointer)CONCAT44(extraout_var,iVar1);
  (this->elements)._M_extent._M_extent_value = extraout_RDX;
  (this->super_SyntaxListBase).childCount =
       local_68.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&local_68.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,(EVP_PKEY_CTX *)alloc);
  return;
}

Assistant:

void resetAll(BumpAllocator& alloc, std::span<const TokenOrSyntax> children) final {
        SmallVector<TokenOrSyntax> buffer(children.size(), UninitializedTag());
        buffer.append_range(children);

        elements = buffer.copy(alloc);
        childCount = buffer.size();
    }